

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O0

void __thiscall RealApplyDiff::test_method(RealApplyDiff *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_418;
  double local_3f8;
  assertion_result local_3f0;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_3b8;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_390;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_350 [40];
  undefined1 local_328 [8];
  MatrixXd J;
  Matrix<double,__1,__1,_0,__1,__1> local_2e8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_2d0;
  undefined1 local_2c0 [8];
  MatrixXd expectedRes;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_298;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_270;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_248 [24];
  Point local_230 [296];
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_108 [24];
  undefined1 local_f0 [8];
  VectorXd x;
  undefined1 local_c8 [8];
  MatrixXd Jf;
  Index repDim;
  Index local_98;
  Index dim;
  RealSpace Space;
  int local_14;
  RealApplyDiff *pRStack_10;
  int c;
  RealApplyDiff *this_local;
  
  local_14 = 5;
  pRStack_10 = this;
  mnf::RealSpace::RealSpace((RealSpace *)&dim,7);
  local_98 = mnf::Manifold::dim();
  Jf.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random
            ((RandomReturnType *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (long)local_14,
             Jf.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_f0,local_108);
  mnf::Point::~Point(local_230);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_248,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f0,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_270,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f0,(type *)0x0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)
             &expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_cols,local_98);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_298,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols,(type *)0x0);
  mnf::Manifold::retractation(&dim,local_248,&local_270,&local_298);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_298);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_270);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_2c0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f0,(type *)0x0);
  mnf::Manifold::diffRetractation((Ref_conflict *)&local_2e8);
  local_2d0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_c8,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2e8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_2c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_2d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2e8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            ((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_328,&local_14,&local_98);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_350,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_328,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_390,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c8,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_3b8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f0,(type *)0x0);
  mnf::Manifold::applyDiffRetractation(&dim,local_350,&local_390,&local_3b8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_3b8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_390);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c8,0x9c,&local_3d8);
    local_3f8 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            isApprox<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2c0,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_328,&local_3f8)
    ;
    boost::test_tools::assertion_result::assertion_result(&local_3f0,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,"expectedRes.isApprox(J)",0x17);
    boost::unit_test::operator<<(&local_418,prev,&local_428);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    boost::test_tools::tt_detail::report_assertion(&local_3f0,&local_418,&local_438,0x9c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_418);
    boost::test_tools::assertion_result::~assertion_result(&local_3f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_328);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_2c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_c8);
  mnf::RealSpace::~RealSpace((RealSpace *)&dim);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RealApplyDiff)
{
  int c = 5;
  RealSpace Space(7);
  Index dim = Space.dim();
  Index repDim = Space.representationDim();
  Eigen::MatrixXd Jf = Eigen::MatrixXd::Random(c, repDim);
  Eigen::VectorXd x = Space.getZero().value();
  Space.retractation(x, x, Eigen::VectorXd::Random(dim));
  Eigen::MatrixXd expectedRes;
  expectedRes = Jf * Space.diffRetractation(x);
  Eigen::MatrixXd J(c, dim);
  Space.applyDiffRetractation(J, Jf, x);
  BOOST_CHECK(expectedRes.isApprox(J));
}